

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O2

reentrant_put_transaction<void> *
density_tests::detail::
PutUInt8<density::lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
::reentrant_put(reentrant_put_transaction<void> *__return_storage_ptr__,
               conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
               *i_queue,EasyRandom *param_2)

{
  ElementType val;
  reentrant_put_transaction<unsigned_char> transaction;
  uchar local_59;
  reentrant_put_transaction<unsigned_char> local_58;
  reentrant_put_transaction<unsigned_char> local_38;
  
  local_59 = '\b';
  density::
  lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>
  ::start_reentrant_push<unsigned_char&>
            (&local_38,
             (lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>
              *)i_queue,&local_59);
  local_58.m_put.m_user_storage = local_38.m_put.m_user_storage;
  local_58.m_put.m_control_block = local_38.m_put.m_control_block;
  local_58.m_put.m_next_ptr = local_38.m_put.m_next_ptr;
  local_58.m_queue = local_38.m_queue;
  local_38.m_put.m_user_storage = (void *)0x0;
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::reentrant_put_transaction<unsigned_char>::~reentrant_put_transaction(&local_38);
  exception_checkpoint();
  (__return_storage_ptr__->m_put).m_user_storage = local_58.m_put.m_user_storage;
  (__return_storage_ptr__->m_put).m_control_block = local_58.m_put.m_control_block;
  (__return_storage_ptr__->m_put).m_next_ptr = local_58.m_put.m_next_ptr;
  __return_storage_ptr__->m_queue = local_38.m_queue;
  local_58.m_put.m_user_storage = (void *)0x0;
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::reentrant_put_transaction<unsigned_char>::~reentrant_put_transaction(&local_58);
  return __return_storage_ptr__;
}

Assistant:

static typename QUEUE::template reentrant_put_transaction<void>
              reentrant_put(QUEUE & i_queue, EasyRandom &)
            {
                ElementType val         = 8;
                auto        transaction = i_queue.start_reentrant_push(val);
                exception_checkpoint();
                return std::move(transaction);
            }